

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Factory.cpp
# Opt level: O0

bool Rml::Factory::InstanceElementText(Element *parent,String *in_text)

{
  char c_00;
  code *pcVar1;
  bool bVar2;
  reference pcVar3;
  String *pSVar4;
  pointer pSVar5;
  void *pvVar6;
  size_t sVar7;
  undefined8 uVar8;
  pointer base_instance;
  type var;
  char *pcVar9;
  pair<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>,_bool>
  pVar10;
  unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_> local_238;
  String local_230;
  ElementText *local_210;
  ElementText *text_element;
  String local_200;
  allocator<char> local_1d9;
  String local_1d8;
  unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_> local_1b8;
  ElementPtr element;
  Variant local_1a0;
  undefined1 local_178 [8];
  XMLAttributes attributes;
  undefined1 local_140 [8];
  String close_tag;
  undefined1 local_100 [8];
  String open_tag;
  undefined1 local_d8 [8];
  String tag;
  Context *context;
  unique_ptr<Rml::StreamMemory,_std::default_delete<Rml::StreamMemory>_> local_a8;
  UniquePtr<Rml::StreamMemory> stream;
  char *error_str;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_90;
  char c;
  iterator __end1;
  iterator __begin1;
  String *__range1;
  bool local_70;
  bool local_6f;
  byte local_6e;
  byte local_6d;
  int iStack_6c;
  char previous;
  bool inside_string;
  bool inside_brackets;
  bool has_data_expression;
  bool parse_as_rml;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  undefined1 local_55;
  bool only_white_space;
  SystemInterface *local_48;
  SystemInterface *system_interface;
  String text;
  String *in_text_local;
  Element *parent_local;
  
  text.field_2._8_8_ = in_text;
  if ((parent == (Element *)0x0) &&
     (bVar2 = Assert("RMLUI_ASSERT(parent)",
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/Factory.cpp"
                     ,0x165), !bVar2)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  ::std::__cxx11::string::string((string *)&system_interface);
  local_48 = GetSystemInterface();
  if (local_48 != (SystemInterface *)0x0) {
    (*local_48->_vptr_SystemInterface[3])(local_48,&system_interface,text.field_2._8_8_);
  }
  local_60._M_current = (char *)::std::__cxx11::string::begin();
  _inside_string = (char *)::std::__cxx11::string::end();
  local_55 = ::std::all_of<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,bool(*)(char)>
                       (local_60,_inside_string,StringUtilities::IsWhitespace);
  if ((bool)local_55) {
    parent_local._7_1_ = 1;
    iStack_6c = 1;
  }
  else {
    local_6d = 0;
    local_6e = 0;
    local_6f = false;
    local_70 = false;
    __range1._7_1_ = '\0';
    __end1._M_current = (char *)::std::__cxx11::string::begin();
    _Stack_90._M_current = (char *)::std::__cxx11::string::end();
    while (bVar2 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffff70), bVar2) {
      pcVar3 = __gnu_cxx::
               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&__end1);
      c_00 = *pcVar3;
      stream._M_t.super___uniq_ptr_impl<Rml::StreamMemory,_std::default_delete<Rml::StreamMemory>_>.
      _M_t.super__Tuple_impl<0UL,_Rml::StreamMemory_*,_std::default_delete<Rml::StreamMemory>_>.
      super__Head_base<0UL,_Rml::StreamMemory_*,_false>._M_head_impl =
           (__uniq_ptr_data<Rml::StreamMemory,_std::default_delete<Rml::StreamMemory>,_true,_true>)
           XMLParseTools::ParseDataBrackets(&local_6f,&local_70,c_00,__range1._7_1_);
      if ((tuple<Rml::StreamMemory_*,_std::default_delete<Rml::StreamMemory>_>)
          stream._M_t.
          super___uniq_ptr_impl<Rml::StreamMemory,_std::default_delete<Rml::StreamMemory>_>._M_t.
          super__Tuple_impl<0UL,_Rml::StreamMemory_*,_std::default_delete<Rml::StreamMemory>_>.
          super__Head_base<0UL,_Rml::StreamMemory_*,_false>._M_head_impl !=
          (_Head_base<0UL,_Rml::StreamMemory_*,_false>)0x0) {
        uVar8 = ::std::__cxx11::string::c_str();
        Log::Message(LT_WARNING,"Failed to instance text element \'%s\'. %s",uVar8,
                     stream._M_t.
                     super___uniq_ptr_impl<Rml::StreamMemory,_std::default_delete<Rml::StreamMemory>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_Rml::StreamMemory_*,_std::default_delete<Rml::StreamMemory>_>
                     .super__Head_base<0UL,_Rml::StreamMemory_*,_false>._M_head_impl);
        parent_local._7_1_ = 0;
        iStack_6c = 1;
        goto LAB_005af50c;
      }
      if ((local_6f & 1U) == 0) {
        if (c_00 == '<') {
          local_6d = 1;
        }
      }
      else {
        local_6e = 1;
      }
      __gnu_cxx::
      __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&__end1);
      __range1._7_1_ = c_00;
    }
    if ((local_6d & 1) == 0) {
      itlib::
      flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
      ::flat_map((flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
                  *)local_178);
      if ((local_6e & 1) != 0) {
        Variant::Variant(&local_1a0);
        pVar10 = itlib::
                 flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>
                 ::emplace<char_const(&)[10],Rml::Variant>
                           ((flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>
                             *)local_178,(char (*) [10])"data-text",&local_1a0);
        element._M_t.super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
        super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
        super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl =
             (__uniq_ptr_data<Rml::Element,_Rml::Releaser<Rml::Element>,_true,_true>)
             pVar10.first._M_current;
        Variant::~Variant(&local_1a0);
      }
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d8,"#text",&local_1d9);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_200,"#text",(allocator<char> *)((long)&text_element + 7));
      InstanceElement((Factory *)&local_1b8,parent,&local_1d8,&local_200,(XMLAttributes *)local_178)
      ;
      ::std::__cxx11::string::~string((string *)&local_200);
      ::std::allocator<char>::~allocator((allocator<char> *)((long)&text_element + 7));
      ::std::__cxx11::string::~string((string *)&local_1d8);
      ::std::allocator<char>::~allocator(&local_1d9);
      bVar2 = ::std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_1b8);
      if (bVar2) {
        base_instance =
             ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::get(&local_1b8);
        local_210 = rmlui_dynamic_cast<Rml::ElementText*,Rml::Element*>(base_instance);
        if (local_210 == (ElementText *)0x0) {
          uVar8 = ::std::__cxx11::string::c_str();
          var = ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::operator*(&local_1b8)
          ;
          pcVar9 = rmlui_type_name<Rml::Element>(var);
          Log::Message(LT_ERROR,
                       "Failed to instance text element \'%s\'. Found type \'%s\', was expecting a derivative of ElementText."
                       ,uVar8,pcVar9);
          parent_local._7_1_ = 0;
          iStack_6c = 1;
        }
        else {
          StringUtilities::DecodeRml(&local_230,(String *)&system_interface);
          ::std::__cxx11::string::operator=((string *)&system_interface,(string *)&local_230);
          ::std::__cxx11::string::~string((string *)&local_230);
          ElementText::SetText(local_210,(String *)&system_interface);
          ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::unique_ptr
                    (&local_238,&local_1b8);
          Element::AppendChild(parent,&local_238,true);
          ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::~unique_ptr(&local_238);
          iStack_6c = 0;
        }
      }
      else {
        uVar8 = ::std::__cxx11::string::c_str();
        Log::Message(LT_ERROR,"Failed to instance text element \'%s\', instancer returned nullptr.",
                     uVar8);
        parent_local._7_1_ = 0;
        iStack_6c = 1;
      }
      ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::~unique_ptr(&local_1b8);
      itlib::
      flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
      ::~flat_map((flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
                   *)local_178);
      if (iStack_6c != 0) goto LAB_005af50c;
    }
    else {
      ::std::__cxx11::string::size();
      MakeUnique<Rml::StreamMemory,unsigned_long>((unsigned_long *)&local_a8);
      tag.field_2._8_8_ = Element::GetContext(parent);
      open_tag.field_2._M_local_buf[0xe] = '\0';
      if ((Context *)tag.field_2._8_8_ == (Context *)0x0) {
        ::std::allocator<char>::allocator();
        open_tag.field_2._M_local_buf[0xe] = '\x01';
        ::std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_d8,"body",
                   (allocator<char> *)(open_tag.field_2._M_local_buf + 0xf));
      }
      else {
        pSVar4 = Context::GetDocumentsBaseTag_abi_cxx11_((Context *)tag.field_2._8_8_);
        ::std::__cxx11::string::string((string *)local_d8,(string *)pSVar4);
      }
      if ((open_tag.field_2._M_local_buf[0xe] & 1U) != 0) {
        ::std::allocator<char>::~allocator((allocator<char> *)(open_tag.field_2._M_local_buf + 0xf))
        ;
      }
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&close_tag.field_2 + 8),"<",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8
                      );
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_100,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&close_tag.field_2 + 8),">");
      ::std::__cxx11::string::~string((string *)(close_tag.field_2._M_local_buf + 8));
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &attributes.m_container.
                        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,"</",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8
                      );
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_140,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &attributes.m_container.
                        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,">");
      ::std::__cxx11::string::~string
                ((string *)
                 &attributes.m_container.
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      pSVar5 = ::std::unique_ptr<Rml::StreamMemory,_std::default_delete<Rml::StreamMemory>_>::
               operator->(&local_a8);
      pvVar6 = (void *)::std::__cxx11::string::c_str();
      sVar7 = ::std::__cxx11::string::size();
      StreamMemory::Write(pSVar5,pvVar6,sVar7);
      pSVar5 = ::std::unique_ptr<Rml::StreamMemory,_std::default_delete<Rml::StreamMemory>_>::
               operator->(&local_a8);
      Stream::Write(&pSVar5->super_Stream,(String *)&system_interface);
      pSVar5 = ::std::unique_ptr<Rml::StreamMemory,_std::default_delete<Rml::StreamMemory>_>::
               operator->(&local_a8);
      pvVar6 = (void *)::std::__cxx11::string::c_str();
      sVar7 = ::std::__cxx11::string::size();
      StreamMemory::Write(pSVar5,pvVar6,sVar7);
      pSVar5 = ::std::unique_ptr<Rml::StreamMemory,_std::default_delete<Rml::StreamMemory>_>::
               operator->(&local_a8);
      StreamMemory::Seek(pSVar5,0,0);
      pSVar5 = ::std::unique_ptr<Rml::StreamMemory,_std::default_delete<Rml::StreamMemory>_>::get
                         (&local_a8);
      InstanceElementStream(parent,&pSVar5->super_Stream);
      ::std::__cxx11::string::~string((string *)local_140);
      ::std::__cxx11::string::~string((string *)local_100);
      ::std::__cxx11::string::~string((string *)local_d8);
      ::std::unique_ptr<Rml::StreamMemory,_std::default_delete<Rml::StreamMemory>_>::~unique_ptr
                (&local_a8);
    }
    parent_local._7_1_ = 1;
    iStack_6c = 1;
  }
LAB_005af50c:
  ::std::__cxx11::string::~string((string *)&system_interface);
  return (bool)(parent_local._7_1_ & 1);
}

Assistant:

bool Factory::InstanceElementText(Element* parent, const String& in_text)
{
	RMLUI_ASSERT(parent);

	String text;
	if (SystemInterface* system_interface = GetSystemInterface())
		system_interface->TranslateString(text, in_text);

	// If this text node only contains white-space we don't want to construct it.
	const bool only_white_space = std::all_of(text.begin(), text.end(), &StringUtilities::IsWhitespace);
	if (only_white_space)
		return true;

	// See if we need to parse it as RML, and whether the text contains data expressions (curly brackets).
	bool parse_as_rml = false;
	bool has_data_expression = false;

	bool inside_brackets = false;
	bool inside_string = false;
	char previous = 0;
	for (const char c : text)
	{
		const char* error_str = XMLParseTools::ParseDataBrackets(inside_brackets, inside_string, c, previous);
		if (error_str)
		{
			Log::Message(Log::LT_WARNING, "Failed to instance text element '%s'. %s", text.c_str(), error_str);
			return false;
		}

		if (inside_brackets)
			has_data_expression = true;
		else if (c == '<')
			parse_as_rml = true;

		previous = c;
	}

	// If the text contains RML elements then run it through the XML parser again.
	if (parse_as_rml)
	{
		RMLUI_ZoneScopedNC("InstanceStream", 0xDC143C);
		auto stream = MakeUnique<StreamMemory>(text.size() + 32);
		Context* context = parent->GetContext();
		String tag = context ? context->GetDocumentsBaseTag() : "body";
		String open_tag = "<" + tag + ">";
		String close_tag = "</" + tag + ">";
		stream->Write(open_tag.c_str(), open_tag.size());
		stream->Write(text);
		stream->Write(close_tag.c_str(), close_tag.size());
		stream->Seek(0, SEEK_SET);

		InstanceElementStream(parent, stream.get());
	}
	else
	{
		RMLUI_ZoneScopedNC("InstanceText", 0x8FBC8F);

		// Attempt to instance the element.
		XMLAttributes attributes;

		// If we have curly brackets in the text, we tag the element so that the appropriate data view (DataViewText) is constructed.
		if (has_data_expression)
			attributes.emplace("data-text", Variant());

		ElementPtr element = Factory::InstanceElement(parent, "#text", "#text", attributes);
		if (!element)
		{
			Log::Message(Log::LT_ERROR, "Failed to instance text element '%s', instancer returned nullptr.", text.c_str());
			return false;
		}

		// Assign the element its text value.
		ElementText* text_element = rmlui_dynamic_cast<ElementText*>(element.get());
		if (!text_element)
		{
			Log::Message(Log::LT_ERROR, "Failed to instance text element '%s'. Found type '%s', was expecting a derivative of ElementText.",
				text.c_str(), rmlui_type_name(*element));
			return false;
		}

		// Unescape any escaped entities or unicode symbols
		text = StringUtilities::DecodeRml(text);

		text_element->SetText(text);

		// Add to active node.
		parent->AppendChild(std::move(element));
	}

	return true;
}